

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v10::detail::count_digits<3,unsigned_int>(uint n)

{
  int iVar1;
  uint n_local;
  
  iVar1 = 0x1f;
  if ((n | 1) != 0) {
    for (; (n | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  return iVar1 / 3 + 1;
}

Assistant:

FMT_CONSTEXPR auto count_digits(UInt n) -> int {
#ifdef FMT_BUILTIN_CLZ
  if (!is_constant_evaluated() && num_bits<UInt>() == 32)
    return (FMT_BUILTIN_CLZ(static_cast<uint32_t>(n) | 1) ^ 31) / BITS + 1;
#endif
  // Lambda avoids unreachable code warnings from NVHPC.
  return [](UInt m) {
    int num_digits = 0;
    do {
      ++num_digits;
    } while ((m >>= BITS) != 0);
    return num_digits;
  }(n);
}